

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *pRVar1;
  ulong uVar2;
  RowSetEntry *pRVar3;
  long lVar4;
  RowSetEntry *aBucket [40];
  
  memset(aBucket,0,0x140);
  while (pIn != (RowSetEntry *)0x0) {
    pRVar1 = pIn->pRight;
    pIn->pRight = (RowSetEntry *)0x0;
    for (uVar2 = 0; aBucket[uVar2] != (RowSetEntry *)0x0; uVar2 = (ulong)((int)uVar2 + 1)) {
      pIn = rowSetEntryMerge(aBucket[uVar2],pIn);
      aBucket[uVar2] = (RowSetEntry *)0x0;
    }
    aBucket[uVar2] = pIn;
    pIn = pRVar1;
  }
  for (lVar4 = 1; lVar4 != 0x28; lVar4 = lVar4 + 1) {
    pRVar1 = aBucket[lVar4];
    pRVar3 = aBucket[0];
    if ((pRVar1 != (RowSetEntry *)0x0) && (pRVar3 = pRVar1, aBucket[0] != (RowSetEntry *)0x0)) {
      pRVar3 = rowSetEntryMerge(aBucket[0],pRVar1);
    }
    aBucket[0] = pRVar3;
  }
  return aBucket[0];
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = aBucket[0];
  for(i=1; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    if( aBucket[i]==0 ) continue;
    pIn = pIn ? rowSetEntryMerge(pIn, aBucket[i]) : aBucket[i];
  }
  return pIn;
}